

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

void __thiscall Catch::TestSpecParser::endMode(TestSpecParser *this)

{
  Mode MVar1;
  undefined1 auStack_58 [16];
  undefined1 auStack_48 [24];
  string sStack_30;
  
  MVar1 = this->m_mode;
  if (MVar1 - Name < 2) {
    preprocessPattern_abi_cxx11_(&sStack_30,this);
    if (sStack_30._M_string_length != 0) {
      std::make_shared<Catch::TestSpec::NamePattern,std::__cxx11::string&,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_58,
                 &sStack_30);
      auStack_48._0_8_ = auStack_58._0_8_;
      auStack_48._8_8_ = auStack_58._8_8_;
      auStack_58._0_8_ = (pointer)0x0;
      auStack_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
      if (this->m_exclusion == true) {
        std::
        make_shared<Catch::TestSpec::ExcludedPattern,std::shared_ptr<Catch::TestSpec::Pattern>&>
                  ((shared_ptr<Catch::TestSpec::Pattern> *)auStack_58);
        std::__shared_ptr<Catch::TestSpec::Pattern,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<Catch::TestSpec::Pattern,(__gnu_cxx::_Lock_policy)2> *)auStack_48,
                   (__shared_ptr<Catch::TestSpec::ExcludedPattern,_(__gnu_cxx::_Lock_policy)2> *)
                   auStack_58);
        clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
      }
      clara::std::
      vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
      ::push_back(&(this->m_currentFilter).m_patterns,(value_type *)auStack_48);
      clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 8));
    }
    (this->m_substring)._M_string_length = 0;
    *(this->m_substring)._M_dataplus._M_p = '\0';
    this->m_exclusion = false;
    this->m_mode = None;
    std::__cxx11::string::~string((string *)&sStack_30);
    return;
  }
  if (MVar1 != Tag) {
    if (MVar1 == EscapedName) {
      this->m_mode = this->lastMode;
      return;
    }
    this->m_mode = None;
    return;
  }
  preprocessPattern_abi_cxx11_(&sStack_30,this);
  if (sStack_30._M_string_length != 0) {
    if ((sStack_30._M_string_length != 1) && (*sStack_30._M_dataplus._M_p == '.')) {
      std::__cxx11::string::erase(&sStack_30);
      std::make_shared<Catch::TestSpec::TagPattern,char_const(&)[2],std::__cxx11::string&>
                ((char (*) [2])auStack_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x15df87);
      auStack_48._0_8_ = auStack_58._0_8_;
      auStack_48._8_8_ = auStack_58._8_8_;
      auStack_58._0_8_ = (pointer)0x0;
      auStack_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
      if (this->m_exclusion == true) {
        std::
        make_shared<Catch::TestSpec::ExcludedPattern,std::shared_ptr<Catch::TestSpec::Pattern>&>
                  ((shared_ptr<Catch::TestSpec::Pattern> *)auStack_58);
        std::__shared_ptr<Catch::TestSpec::Pattern,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<Catch::TestSpec::Pattern,(__gnu_cxx::_Lock_policy)2> *)auStack_48,
                   (__shared_ptr<Catch::TestSpec::ExcludedPattern,_(__gnu_cxx::_Lock_policy)2> *)
                   auStack_58);
        clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
      }
      clara::std::
      vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
      ::push_back(&(this->m_currentFilter).m_patterns,(value_type *)auStack_48);
      clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 8));
    }
    std::make_shared<Catch::TestSpec::TagPattern,std::__cxx11::string&,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_58,
               &sStack_30);
    auStack_48._0_8_ = auStack_58._0_8_;
    auStack_48._8_8_ = auStack_58._8_8_;
    auStack_58._0_8_ = (pointer)0x0;
    auStack_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
    if (this->m_exclusion == true) {
      std::make_shared<Catch::TestSpec::ExcludedPattern,std::shared_ptr<Catch::TestSpec::Pattern>&>
                ((shared_ptr<Catch::TestSpec::Pattern> *)auStack_58);
      std::__shared_ptr<Catch::TestSpec::Pattern,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Catch::TestSpec::Pattern,(__gnu_cxx::_Lock_policy)2> *)auStack_48,
                 (__shared_ptr<Catch::TestSpec::ExcludedPattern,_(__gnu_cxx::_Lock_policy)2> *)
                 auStack_58);
      clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
    }
    clara::std::
    vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(this->m_currentFilter).m_patterns,(value_type *)auStack_48);
    clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 8));
  }
  (this->m_substring)._M_string_length = 0;
  *(this->m_substring)._M_dataplus._M_p = '\0';
  this->m_exclusion = false;
  this->m_mode = None;
  std::__cxx11::string::~string((string *)&sStack_30);
  return;
}

Assistant:

void TestSpecParser::endMode() {
        switch( m_mode ) {
        case Name:
        case QuotedName:
            return addNamePattern();
        case Tag:
            return addTagPattern();
        case EscapedName:
            revertBackToLastMode();
            return;
        case None:
        default:
            return startNewMode( None );
        }
    }